

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManLutMffcSize(Gia_Man_t *p,int iObj,Vec_Int_t *vTemp,Vec_Bit_t *vMarksAnd)

{
  int iVar1;
  int i;
  int iVar2;
  Vec_Int_t *vLeaves;
  int i_00;
  int iObj_local;
  
  iVar1 = Gia_ObjIsLut2(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut2(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x1ba,"int Spl_ManLutMffcSize(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *)");
  }
  Gia_ManIncrementTravId(p);
  vLeaves = Gia_ObjLutFanins2(p,iObj);
  Gia_ManCollectAnds(p,&iObj_local,1,vTemp,vLeaves);
  iVar1 = 0;
  for (i_00 = 0; i_00 < vTemp->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vTemp,i_00);
    iVar2 = Vec_BitEntry(vMarksAnd,i);
    if (iVar2 == 0) {
      Vec_IntWriteEntry(vTemp,iVar1,i);
      iVar1 = iVar1 + 1;
    }
  }
  if (iVar1 <= vTemp->nSize) {
    vTemp->nSize = iVar1;
    return iVar1;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Spl_ManLutMffcSize( Gia_Man_t * p, int iObj, Vec_Int_t * vTemp, Vec_Bit_t * vMarksAnd )
{
    int iTemp, i, k = 0;
    assert( Gia_ObjIsLut2(p, iObj) );
//Vec_IntPrint( Gia_ObjLutFanins2(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iObj, 1, vTemp, Gia_ObjLutFanins2(p, iObj) );
    Vec_IntForEachEntry( vTemp, iTemp, i )
        if ( !Vec_BitEntry(vMarksAnd, iTemp) )
            Vec_IntWriteEntry( vTemp, k++, iTemp );
    Vec_IntShrink( vTemp, k );
    return k;
}